

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.h
# Opt level: O0

void __thiscall
cmSetTargetPropertiesCommand::~cmSetTargetPropertiesCommand(cmSetTargetPropertiesCommand *this)

{
  cmSetTargetPropertiesCommand *this_local;
  
  ~cmSetTargetPropertiesCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSetTargetPropertiesCommand; }